

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O2

void FastPForLib::__unpack<28u>(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = 0;
  for (lVar2 = 0; (int)lVar2 != 0x1c; lVar2 = lVar2 + 1) {
    if (uVar3 < 5) {
      uVar1 = uVar3 & 0x1f;
      uVar3 = uVar3 + 0x1c;
      *out = in[lVar2] >> uVar1 & 0xfffffff;
      out = out + 1;
    }
    uVar1 = 0;
    if (uVar3 < 0x20) {
      *out = in[lVar2 + 1] << ((byte)-(char)uVar3 & 0x1f) & 0xfffffff | in[lVar2] >> (uVar3 & 0x1f);
      out = out + 1;
      uVar1 = uVar3 - 4;
    }
    uVar3 = uVar1;
  }
  return;
}

Assistant:

void __unpack(const uint32_t *__restrict__ in, uint32_t *__restrict__ out) {
  uint32_t inwordpointer = 0; // indicates where we are writing
  // k iterates over the input
  for (uint32_t k = 0; k < bit; ++k, ++in) {
    // did not unroll; compiler did not detect invariant that inwordpointer is
    // always
    // small positive number
    /* for (; inwordpointer   /\*+   bit <= 32 *\/ <= 32-bit; inwordpointer +=
     * bit) { */
    /*       *out++ = __bitmask<bit> ((*in) >> inwordpointer); */
    /*   } */
    // grungy replacement to help with unrolling
    for (uint32_t i = 0; i < 1 + 32 / bit; ++i) {
      if (inwordpointer > 32 - bit)
        break;
      *out++ = __bitmask<bit, true>((*in) >> inwordpointer);
      inwordpointer += bit;
    }
    // end ofk grunge

    if (inwordpointer < 32) {
      *out++ = (in[0] >> inwordpointer) |
               __bitmask<bit, true>(in[1] << (32 - inwordpointer));
      inwordpointer += bit - 32;
    } else
      // inwordpointer==32
      inwordpointer = 0;
  }
}